

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SameValueComparer.h
# Opt level: O0

hash_t Js::SameValueComparerCommon<void_*,_true>::HashDouble(double d)

{
  BOOL BVar1;
  long v;
  double d_local;
  
  BVar1 = JavascriptNumber::IsNan(d);
  if (BVar1 == 0) {
    BVar1 = JavascriptNumber::IsNegZero(d);
    v = (long)d;
    if (BVar1 != 0) {
      v = 0;
    }
    d_local._4_4_ = (uint)v ^ (uint)((ulong)v >> 0x20);
  }
  else {
    d_local._4_4_ = 0;
  }
  return d_local._4_4_;
}

Assistant:

static hash_t HashDouble(double d)
        {
            if (JavascriptNumber::IsNan(d))
            {
                return 0;
            }

            if (zero)
            {
                // SameValueZero treats -0 and +0 the same, so normalize to get same hash code
                if (JavascriptNumber::IsNegZero(d))
                {
                    d = 0.0;
                }
            }

            __int64 v = *(__int64*)&d;
            return (uint)v ^ (uint)(v >> 32);
        }